

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void __thiscall rsg::AssignOp::evaluate(AssignOp *this,ExecutionContext *evalCtx)

{
  ExecValueAccess dst;
  int iVar1;
  VariableType *pVVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *extraout_RDX;
  ExecConstValueAccess src;
  ExecConstValueAccess mask;
  ConstStridedValueAccess<64> local_48;
  ConstStridedValueAccess<64> local_38;
  StridedValueRead<64> local_28;
  ExecutionContext *local_18;
  ExecutionContext *evalCtx_local;
  AssignOp *this_local;
  
  local_18 = evalCtx;
  evalCtx_local = (ExecutionContext *)this;
  (*this->m_lvalueExpr->_vptr_Expression[4])(this->m_lvalueExpr,evalCtx);
  (*this->m_rvalueExpr->_vptr_Expression[4])(this->m_rvalueExpr,local_18);
  pVVar2 = ValueRange::getType(&this->m_valueRange);
  ValueStorage<64>::setStorage(&this->m_value,pVVar2);
  iVar1 = (*this->m_rvalueExpr->_vptr_Expression[5])();
  local_38.m_type = (VariableType *)CONCAT44(extraout_var,iVar1);
  local_28 = ConstStridedValueAccess<64>::value(&local_38);
  pVVar2 = ValueRange::getType(&this->m_valueRange);
  local_48 = (ConstStridedValueAccess<64>)ValueStorage<64>::getValue(&this->m_value,pVVar2);
  StridedValueAccess<64>::operator=((StridedValueAccess<64> *)&local_48,&local_28);
  iVar1 = (*this->m_lvalueExpr->_vptr_Expression[6])();
  dst.super_ConstStridedValueAccess<64>.m_type._4_4_ = extraout_var_00;
  dst.super_ConstStridedValueAccess<64>.m_type._0_4_ = iVar1;
  pVVar2 = ValueRange::getType(&this->m_valueRange);
  src = (ExecConstValueAccess)ValueStorage<64>::getValue(&this->m_value,pVVar2);
  mask = ExecutionContext::getExecutionMask(local_18);
  dst.super_ConstStridedValueAccess<64>.m_value = extraout_RDX;
  assignMasked(dst,src,mask);
  return;
}

Assistant:

void AssignOp::evaluate (ExecutionContext& evalCtx)
{
	// Evaluate l-value
	m_lvalueExpr->evaluate(evalCtx);

	// Evaluate value
	m_rvalueExpr->evaluate(evalCtx);
	m_value.setStorage(m_valueRange.getType());
	m_value.getValue(m_valueRange.getType()) = m_rvalueExpr->getValue().value();

	// Assign
	assignMasked(m_lvalueExpr->getLValue(), m_value.getValue(m_valueRange.getType()), evalCtx.getExecutionMask());
}